

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O2

size_t dropt_ssresize(dropt_stringstream *ss,size_t n)

{
  dropt_char *pdVar1;
  dropt_char *pdVar2;
  
  pdVar1 = (dropt_char *)ss->maxSize;
  if ((n < pdVar1) && (pdVar2 = (dropt_char *)(ss->used + 1), n < pdVar2)) {
    n = (size_t)pdVar2;
  }
  if ((dropt_char *)n != (dropt_char *)0x0) {
    if ((dropt_char *)n != pdVar1) {
      pdVar1 = (dropt_char *)dropt_safe_realloc(ss->string,n,1);
      if (pdVar1 != (dropt_char *)0x0) {
        ss->string = pdVar1;
        ss->maxSize = n;
      }
    }
    return (size_t)pdVar1;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                ,0x219,"size_t dropt_ssresize(dropt_stringstream *, size_t)");
}

Assistant:

static size_t
dropt_ssresize(dropt_stringstream* ss, size_t n)
{
    assert(ss != NULL);

    /* Don't allow shrinking if it will truncate the string. */
    if (n < ss->maxSize) { n = MAX(n, ss->used + 1 /* NUL */); }

    /* There should always be a buffer to point to. */
    assert(n > 0);

    if (n != ss->maxSize)
    {
        dropt_char* p = dropt_safe_realloc(ss->string, n, sizeof *ss->string);
        if (p != NULL)
        {
            ss->string = p;
            ss->maxSize = n;
            assert(ss->maxSize > 0);
         }
    }
    return ss->maxSize;
}